

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.h
# Opt level: O1

mz_bool mz_zip_writer_add_from_zip_reader
                  (mz_zip_archive *pZip,mz_zip_archive *pSource_zip,mz_uint src_file_index)

{
  long lVar1;
  int iVar2;
  int iVar3;
  mz_zip_internal_state *pArray;
  mz_zip_internal_state *pmVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  bool bVar7;
  mz_uint64 mVar8;
  uint uVar9;
  mz_bool mVar10;
  size_t sVar11;
  int *piVar12;
  mz_uint8 *pmVar13;
  ulong uVar14;
  uint uVar15;
  int iVar16;
  undefined4 uVar17;
  short *psVar18;
  mz_uint8 *pmVar19;
  void *__src;
  void *pvVar20;
  ulong uVar21;
  mz_uint8 *pmVar22;
  int *pCentral_dir_header;
  uint uVar23;
  mz_zip_array file_data_array;
  mz_uint64 local_dir_header_ofs;
  mz_zip_array new_ext_block;
  mz_uint32 local_header_u32 [8];
  mz_zip_archive_file_stat src_file_stat;
  mz_uint32 *in_stack_fffffffffffffaa0;
  uint local_544;
  mz_uint8 *local_540;
  ulong local_538;
  mz_uint8 *local_530;
  ulong local_528;
  uint local_51c;
  mz_zip_array local_518;
  undefined6 uStack_4f8;
  undefined4 uStack_4f2;
  undefined4 local_4ee;
  ulong local_4e8;
  short *local_4e0;
  ulong local_4d8;
  ulong local_4d0;
  mz_zip_array local_4c8;
  int local_4a8;
  byte local_4a2;
  int local_496;
  int local_492;
  ushort local_48e;
  ushort local_48c;
  mz_zip_archive_file_stat local_488;
  
  if (pZip == (mz_zip_archive *)0x0) {
    return 0;
  }
  pArray = pZip->m_pState;
  if (((pArray == (mz_zip_internal_state *)0x0) || (pZip->m_zip_mode != MZ_ZIP_MODE_WRITING)) ||
     (pSource_zip->m_pRead == (mz_file_read_func)0x0)) {
    if (pZip == (mz_zip_archive *)0x0) {
      return 0;
    }
LAB_0011f91c:
    pZip->m_last_error = MZ_ZIP_INVALID_PARAMETER;
    return 0;
  }
  pmVar4 = pSource_zip->m_pState;
  if ((pmVar4->m_zip64 != 0) && (pArray->m_zip64 == 0)) goto LAB_0011f91c;
  if ((pmVar4 == (mz_zip_internal_state *)0x0 || pSource_zip == (mz_zip_archive *)0x0) ||
     (pSource_zip->m_total_files <= src_file_index)) {
    pCentral_dir_header = (int *)0x0;
  }
  else {
    pCentral_dir_header =
         (int *)((ulong)*(uint *)((long)(pmVar4->m_central_dir_offsets).m_p +
                                 (ulong)src_file_index * 4) + (long)(pmVar4->m_central_dir).m_p);
  }
  if (pCentral_dir_header == (int *)0x0) {
    pZip->m_last_error = MZ_ZIP_INVALID_PARAMETER;
    return 0;
  }
  if (*pCentral_dir_header != 0x2014b50) {
    pZip->m_last_error = MZ_ZIP_INVALID_HEADER_OR_CORRUPTED;
    return 0;
  }
  local_4e8 = (ulong)*(ushort *)(pCentral_dir_header + 7);
  local_4d8 = (ulong)*(ushort *)(pCentral_dir_header + 8);
  local_51c = (uint)*(ushort *)((long)pCentral_dir_header + 0x1e);
  local_528 = (ulong)((uint)*(ushort *)(pCentral_dir_header + 8) +
                      (uint)*(ushort *)(pCentral_dir_header + 7) + local_51c);
  if (((pArray->m_central_dir).m_size + local_528) - 0xffffffb1 < 0xffffffff00000001) {
    pZip->m_last_error = MZ_ZIP_UNSUPPORTED_CDIR_SIZE;
    return 0;
  }
  if (pZip->m_file_offset_alignment == 0) {
    uVar9 = 0;
  }
  else {
    iVar16 = (int)pZip->m_file_offset_alignment;
    uVar9 = iVar16 - 1;
    uVar9 = iVar16 - ((uint)pZip->m_archive_size & uVar9) & uVar9;
  }
  if (pArray->m_zip64 == 0) {
    if (pZip->m_total_files == 0xffff) goto LAB_0011fbaf;
  }
  else if (pZip->m_total_files == 0xffffffff) {
LAB_0011fbaf:
    pZip->m_last_error = MZ_ZIP_TOO_MANY_FILES;
    return 0;
  }
  mVar10 = mz_zip_file_stat_internal
                     (pSource_zip,src_file_index,(mz_uint8 *)pCentral_dir_header,&local_488,
                      (mz_bool *)0x0);
  mVar8 = local_488.m_local_header_ofs;
  if (mVar10 == 0) {
    return 0;
  }
  local_540 = (mz_uint8 *)pZip->m_archive_size;
  sVar11 = (*pSource_zip->m_pRead)
                     (pSource_zip->m_pIO_opaque,local_488.m_local_header_ofs,&local_4a8,0x1e);
  if (sVar11 != 0x1e) goto LAB_00120028;
  if (local_4a8 != 0x4034b50) {
    pZip->m_last_error = MZ_ZIP_INVALID_HEADER_OR_CORRUPTED;
    return 0;
  }
  uVar21 = (ulong)local_48c;
  local_530 = (mz_uint8 *)(((uint)local_48c + (uint)local_48e) + local_488.m_comp_size);
  uVar17 = 0;
  if ((local_48c != 0) && ((local_496 == -1 || (uVar17 = 0, local_492 == -1)))) {
    local_518.m_p = (short *)0x0;
    local_518.m_size._0_6_ = 0;
    local_518.m_size._6_2_ = 0;
    local_518.m_capacity._0_4_ = 0;
    local_518.m_capacity._4_2_ = 0;
    local_518.m_capacity._6_2_ = 0;
    local_518._28_2_ = 0;
    local_518._30_2_ = 0;
    local_518.m_element_size = 1;
    uVar14 = (ulong)local_48e;
    if ((uVar21 == 0) ||
       (local_538 = (ulong)local_48e,
       mVar10 = mz_zip_array_ensure_capacity(pZip,&local_518,uVar21,0), uVar14 = local_538,
       mVar10 != 0)) {
      local_518.m_size._0_6_ = (uint6)local_48c;
      local_518.m_size._6_2_ = 0;
      local_4e0 = (short *)local_518.m_p;
      sVar11 = (*pSource_zip->m_pRead)
                         (pSource_zip->m_pIO_opaque,uVar14 + 0x1e + local_488.m_local_header_ofs,
                          local_518.m_p,uVar21);
      if (sVar11 != uVar21) {
        (*pZip->m_pFree)(pZip->m_pAlloc_opaque,local_4e0);
        local_518.m_p = (short *)0x0;
        local_518.m_size._0_6_ = 0;
        local_518.m_size._6_2_ = 0;
        local_518.m_capacity._0_4_ = 0;
        local_518.m_capacity._4_2_ = 0;
        local_518.m_capacity._6_2_ = 0;
        local_518.m_element_size = 0;
        local_518._28_2_ = 0;
        local_518._30_2_ = 0;
        pZip->m_last_error = MZ_ZIP_FILE_READ_FAILED;
        goto LAB_0011fc16;
      }
      local_538 = local_538 & 0xffffffff00000000;
      psVar18 = local_4e0;
      do {
        uVar23 = (uint)uVar21;
        if (uVar23 < 4) {
LAB_0011fb3b:
          (*pZip->m_pFree)(pZip->m_pAlloc_opaque,local_518.m_p);
          local_518.m_p = (short *)0x0;
          local_518.m_size._0_6_ = 0;
          local_518.m_size._6_2_ = 0;
          local_518.m_capacity._0_4_ = 0;
          local_518.m_capacity._4_2_ = 0;
          local_518.m_capacity._6_2_ = 0;
          local_518.m_element_size = 0;
          local_518._28_2_ = 0;
          local_518._30_2_ = 0;
          pZip->m_last_error = MZ_ZIP_INVALID_HEADER_OR_CORRUPTED;
          iVar16 = 1;
LAB_0011fb70:
          bVar7 = false;
        }
        else {
          lVar1 = (ulong)(ushort)psVar18[1] + 4;
          uVar15 = (uint)lVar1;
          if (uVar23 < uVar15) goto LAB_0011fb3b;
          if (*psVar18 == 1) {
            if ((ushort)psVar18[1] < 0x10) goto LAB_0011fb3b;
            local_538 = CONCAT44(local_538._4_4_,1);
            iVar16 = 2;
            goto LAB_0011fb70;
          }
          psVar18 = (short *)((long)psVar18 + lVar1);
          iVar16 = 0;
          bVar7 = true;
          uVar21 = (ulong)(uVar23 - uVar15);
        }
        if (iVar16 != 0) {
          if (iVar16 != 2) goto LAB_0011fc09;
          break;
        }
      } while ((int)uVar21 != 0);
      (*pZip->m_pFree)(pZip->m_pAlloc_opaque,local_518.m_p);
      local_518.m_p = (short *)0x0;
      local_518.m_size._0_6_ = 0;
      local_518.m_size._6_2_ = 0;
      local_518.m_capacity._0_4_ = 0;
      local_518.m_capacity._4_2_ = 0;
      local_518.m_capacity._6_2_ = 0;
      local_518.m_element_size = 0;
      local_518._28_2_ = 0;
      local_518._30_2_ = 0;
      bVar7 = true;
LAB_0011fc09:
      uVar17 = (int)local_538;
    }
    else {
      pZip->m_last_error = MZ_ZIP_ALLOC_FAILED;
LAB_0011fc16:
      bVar7 = false;
      uVar17 = 0;
    }
    if (!bVar7) {
      return 0;
    }
  }
  local_538 = CONCAT44(local_538._4_4_,uVar17);
  if ((pArray->m_zip64 == 0) &&
     ((mz_uint8 *)0xfffffffe <
      local_530 + (pArray->m_central_dir).m_size + 0xb2 + uVar9 + local_528 + (long)local_540)) {
    pZip->m_last_error = MZ_ZIP_ARCHIVE_TOO_LARGE;
    return 0;
  }
  mVar10 = mz_zip_writer_write_zeros(pZip,(mz_uint64)local_540,uVar9);
  if (mVar10 == 0) {
    return 0;
  }
  uVar21 = (long)local_540 + (ulong)uVar9;
  local_4d0 = uVar21;
  if ((pZip->m_file_offset_alignment != 0) && ((pZip->m_file_offset_alignment - 1 & uVar21) != 0)) {
    __assert_fail("(local_dir_header_ofs & (pZip->m_file_offset_alignment - 1)) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/MW55[P]DNA-Aeon/cpp/src/../../Zippy/library/Zippy/miniz/miniz.h"
                  ,0x21f4,
                  "mz_bool mz_zip_writer_add_from_zip_reader(mz_zip_archive *, mz_zip_archive *, mz_uint)"
                 );
  }
  sVar11 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,uVar21,&local_4a8,0x1e);
  if (sVar11 != 0x1e) {
LAB_001202f0:
    pZip->m_last_error = MZ_ZIP_FILE_WRITE_FAILED;
    return 0;
  }
  pmVar13 = (mz_uint8 *)0x10000;
  if (local_530 < (mz_uint8 *)0x10000) {
    pmVar13 = local_530;
  }
  pmVar19 = (mz_uint8 *)0x20;
  if ((mz_uint8 *)0x20 < pmVar13) {
    pmVar19 = pmVar13;
  }
  piVar12 = (int *)(*pZip->m_pAlloc)(pZip->m_pAlloc_opaque,1,(size_t)pmVar19);
  if (piVar12 == (int *)0x0) goto LAB_00120363;
  pmVar19 = (mz_uint8 *)(mVar8 + 0x1e);
  local_540 = (mz_uint8 *)(uVar21 + 0x1e);
  pmVar13 = local_530;
  if (local_530 == (mz_uint8 *)0x0) {
    pmVar22 = (mz_uint8 *)(ulong)local_544;
  }
  else {
    do {
      pmVar22 = (mz_uint8 *)0x10000;
      if (pmVar13 < (mz_uint8 *)0x10000) {
        pmVar22 = pmVar13;
      }
      local_530 = pmVar13;
      pmVar13 = (mz_uint8 *)
                (*pSource_zip->m_pRead)
                          (pSource_zip->m_pIO_opaque,(mz_uint64)pmVar19,piVar12,(size_t)pmVar22);
      local_544 = (uint)pmVar22;
      if (pmVar13 != pmVar22) goto LAB_0012001c;
      pmVar13 = (mz_uint8 *)
                (*pZip->m_pWrite)(pZip->m_pIO_opaque,(mz_uint64)local_540,piVar12,(size_t)pmVar22);
      if (pmVar13 != pmVar22) goto LAB_001202e4;
      pmVar19 = pmVar19 + (long)pmVar22;
      local_540 = local_540 + (long)pmVar22;
      pmVar13 = local_530 + -(long)pmVar22;
    } while (pmVar13 != (mz_uint8 *)0x0);
  }
  local_544 = (uint)pmVar22;
  if ((local_4a2 & 8) != 0) {
    if ((int)local_538 == 0 && pSource_zip->m_pState->m_zip64 == 0) {
      sVar11 = (*pSource_zip->m_pRead)(pSource_zip->m_pIO_opaque,(mz_uint64)pmVar19,piVar12,0x10);
      if (sVar11 == 0x10) {
        if (pZip->m_pState->m_zip64 == 0) {
          local_544 = (uint)(*piVar12 == 0x8074b50) * 4 + 0xc;
        }
        else {
          uVar21 = (ulong)(*piVar12 == 0x8074b50);
          iVar16 = piVar12[uVar21];
          iVar2 = piVar12[uVar21 + 1];
          iVar3 = piVar12[uVar21 + 2];
          *piVar12 = 0x8074b50;
          *(char *)(piVar12 + 1) = (char)iVar16;
          *(char *)((long)piVar12 + 5) = (char)((uint)iVar16 >> 8);
          *(char *)((long)piVar12 + 6) = (char)((uint)iVar16 >> 0x10);
          *(char *)((long)piVar12 + 7) = (char)((uint)iVar16 >> 0x18);
          *(char *)(piVar12 + 2) = (char)iVar2;
          *(char *)((long)piVar12 + 9) = (char)((uint)iVar2 >> 8);
          *(char *)((long)piVar12 + 10) = (char)((uint)iVar2 >> 0x10);
          *(char *)((long)piVar12 + 0xb) = (char)((uint)iVar2 >> 0x18);
          piVar12[3] = 0;
          *(char *)(piVar12 + 4) = (char)iVar3;
          *(char *)((long)piVar12 + 0x11) = (char)((uint)iVar3 >> 8);
          *(char *)((long)piVar12 + 0x12) = (char)((uint)iVar3 >> 0x10);
          *(char *)((long)piVar12 + 0x13) = (char)((uint)iVar3 >> 0x18);
          piVar12[5] = 0;
          local_544 = 0x18;
        }
      }
      else {
        (*pZip->m_pFree)(pZip->m_pAlloc_opaque,piVar12);
        pZip->m_last_error = MZ_ZIP_FILE_READ_FAILED;
      }
      if (sVar11 != 0x10) {
        return 0;
      }
    }
    else {
      sVar11 = (*pSource_zip->m_pRead)(pSource_zip->m_pIO_opaque,(mz_uint64)pmVar19,piVar12,0x18);
      if (sVar11 != 0x18) {
LAB_0012001c:
        (*pZip->m_pFree)(pZip->m_pAlloc_opaque,piVar12);
LAB_00120028:
        pZip->m_last_error = MZ_ZIP_FILE_READ_FAILED;
        return 0;
      }
      local_544 = (uint)(*piVar12 == 0x8074b50) * 4 + 0x14;
    }
    uVar21 = (ulong)local_544;
    sVar11 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,(mz_uint64)local_540,piVar12,uVar21);
    if (sVar11 != uVar21) {
LAB_001202e4:
      (*pZip->m_pFree)(pZip->m_pAlloc_opaque,piVar12);
      goto LAB_001202f0;
    }
    local_540 = local_540 + uVar21;
  }
  (*pZip->m_pFree)(pZip->m_pAlloc_opaque,piVar12);
  uVar21 = (pArray->m_central_dir).m_size;
  local_518.m_p = *(void **)pCentral_dir_header;
  uVar5 = *(undefined8 *)(pCentral_dir_header + 4);
  uVar6 = *(undefined8 *)(pCentral_dir_header + 6);
  uStack_4f8 = (undefined6)((ulong)*(undefined8 *)((long)pCentral_dir_header + 0x1e) >> 0x10);
  local_518.m_size._0_6_ = (uint6)*(undefined8 *)(pCentral_dir_header + 2);
  local_518.m_size._6_2_ = (undefined2)((ulong)*(undefined8 *)(pCentral_dir_header + 2) >> 0x30);
  local_518.m_capacity._0_4_ = (undefined4)uVar5;
  local_518.m_capacity._4_2_ = (undefined2)((ulong)uVar5 >> 0x20);
  local_518.m_capacity._6_2_ = (undefined2)((ulong)uVar5 >> 0x30);
  local_518.m_element_size = (mz_uint)uVar6;
  local_518._28_2_ = SUB82((ulong)uVar6 >> 0x20,0);
  local_518._30_2_ = SUB82((ulong)uVar6 >> 0x30,0);
  uStack_4f2 = (undefined4)*(undefined8 *)((long)pCentral_dir_header + 0x26);
  if (pArray->m_zip64 == 0) {
    if (((ulong)local_540 >> 0x20 != 0) || (0xfffffffe < local_4d0)) {
      pZip->m_last_error = MZ_ZIP_ARCHIVE_TOO_LARGE;
      return 0;
    }
    _uStack_4f2 = CONCAT44((int)local_4d0,uStack_4f2);
    uVar14 = uVar21 + 0x2e;
    if (((pArray->m_central_dir).m_capacity < uVar14) &&
       (mVar10 = mz_zip_array_ensure_capacity(pZip,&pArray->m_central_dir,uVar14,1), mVar10 == 0))
    goto LAB_00120363;
    (pArray->m_central_dir).m_size = uVar14;
    uVar14 = (ulong)(pArray->m_central_dir).m_element_size;
    memcpy((void *)(uVar21 * uVar14 + (long)(pArray->m_central_dir).m_p),&local_518,uVar14 * 0x2e);
    sVar11 = (pArray->m_central_dir).m_size;
    uVar14 = sVar11 + local_528;
    if ((uVar14 <= (pArray->m_central_dir).m_capacity) ||
       (mVar10 = mz_zip_array_ensure_capacity(pZip,&pArray->m_central_dir,uVar14,1), mVar10 != 0)) {
      (pArray->m_central_dir).m_size = uVar14;
      uVar14 = (ulong)(pArray->m_central_dir).m_element_size;
      memcpy((void *)(sVar11 * uVar14 + (long)(pArray->m_central_dir).m_p),
             (void *)((long)pCentral_dir_header + 0x2e),local_528 * uVar14);
LAB_001201e9:
      if (0xfffffffe < (pArray->m_central_dir).m_size) {
        if ((uVar21 <= (pArray->m_central_dir).m_capacity) ||
           (mVar10 = mz_zip_array_ensure_capacity(pZip,&pArray->m_central_dir,uVar21,0), mVar10 != 0
           )) {
          (pArray->m_central_dir).m_size = uVar21;
        }
        pZip->m_last_error = MZ_ZIP_UNSUPPORTED_CDIR_SIZE;
        return 0;
      }
      local_544 = (uint)uVar21;
      sVar11 = (pArray->m_central_dir_offsets).m_size;
      uVar14 = sVar11 + 1;
      if ((uVar14 <= (pArray->m_central_dir_offsets).m_capacity) ||
         (mVar10 = mz_zip_array_ensure_capacity(pZip,&pArray->m_central_dir_offsets,uVar14,1),
         mVar10 != 0)) {
        (pArray->m_central_dir_offsets).m_size = uVar14;
        uVar21 = (ulong)(pArray->m_central_dir_offsets).m_element_size;
        memcpy((void *)(sVar11 * uVar21 + (long)(pArray->m_central_dir_offsets).m_p),&local_544,
               uVar21);
        pZip->m_total_files = pZip->m_total_files + 1;
        pZip->m_archive_size = (mz_uint64)local_540;
        return 1;
      }
    }
  }
  else {
    local_530 = (mz_uint8 *)((long)pCentral_dir_header + local_4e8 + 0x2e);
    local_4c8._0_24_ = SUB3224(ZEXT832(0),0) << 0x20;
    local_4c8.m_element_size = 1;
    local_4c8._28_4_ = 0;
    local_518.m_capacity._4_2_ = 0xffff;
    local_518.m_capacity._6_2_ = 0xffff;
    local_518.m_element_size = 0xffffffff;
    _uStack_4f2 = CONCAT44(0xffffffff,uStack_4f2);
    mVar10 = mz_zip_writer_update_zip64_extension_block
                       (&local_4c8,pZip,local_530,local_51c,&local_488.m_comp_size,
                        &local_488.m_uncomp_size,&local_4d0,in_stack_fffffffffffffaa0);
    if (mVar10 == 0) {
      (*pZip->m_pFree)(pZip->m_pAlloc_opaque,local_4c8.m_p);
      return 0;
    }
    local_528 = local_4c8.m_size;
    local_518._30_2_ = local_4c8.m_size._0_2_;
    sVar11 = (pArray->m_central_dir).m_size;
    uVar14 = sVar11 + 0x2e;
    if (((pArray->m_central_dir).m_capacity < uVar14) &&
       (mVar10 = mz_zip_array_ensure_capacity(pZip,&pArray->m_central_dir,uVar14,1), mVar10 == 0)) {
      (*pZip->m_pFree)(pZip->m_pAlloc_opaque,local_4c8.m_p);
      goto LAB_00120363;
    }
    (pArray->m_central_dir).m_size = uVar14;
    uVar14 = (ulong)(pArray->m_central_dir).m_element_size;
    memcpy((void *)(sVar11 * uVar14 + (long)(pArray->m_central_dir).m_p),&local_518,uVar14 * 0x2e);
    sVar11 = (pArray->m_central_dir).m_size;
    uVar14 = sVar11 + local_4e8;
    if (((pArray->m_central_dir).m_capacity < uVar14) &&
       (mVar10 = mz_zip_array_ensure_capacity(pZip,&pArray->m_central_dir,uVar14,1), mVar10 == 0)) {
      pvVar20 = pZip->m_pAlloc_opaque;
      __src = local_4c8.m_p;
    }
    else {
      (pArray->m_central_dir).m_size = uVar14;
      uVar14 = (ulong)(pArray->m_central_dir).m_element_size;
      memcpy((void *)(sVar11 * uVar14 + (long)(pArray->m_central_dir).m_p),
             (void *)((long)pCentral_dir_header + 0x2e),local_4e8 * uVar14);
      __src = local_4c8.m_p;
      sVar11 = (pArray->m_central_dir).m_size;
      uVar14 = sVar11 + local_528;
      if ((uVar14 <= (pArray->m_central_dir).m_capacity) ||
         (mVar10 = mz_zip_array_ensure_capacity(pZip,&pArray->m_central_dir,uVar14,1), mVar10 != 0))
      {
        (pArray->m_central_dir).m_size = uVar14;
        uVar14 = (ulong)(pArray->m_central_dir).m_element_size;
        memcpy((void *)(sVar11 * uVar14 + (long)(pArray->m_central_dir).m_p),__src,
               local_528 * uVar14);
        sVar11 = (pArray->m_central_dir).m_size;
        uVar14 = sVar11 + local_4d8;
        if ((uVar14 <= (pArray->m_central_dir).m_capacity) ||
           (mVar10 = mz_zip_array_ensure_capacity(pZip,&pArray->m_central_dir,uVar14,1), mVar10 != 0
           )) {
          (pArray->m_central_dir).m_size = uVar14;
          uVar14 = (ulong)(pArray->m_central_dir).m_element_size;
          memcpy((void *)(sVar11 * uVar14 + (long)(pArray->m_central_dir).m_p),local_530 + local_51c
                 ,local_4d8 * uVar14);
          (*pZip->m_pFree)(pZip->m_pAlloc_opaque,__src);
          goto LAB_001201e9;
        }
      }
      pvVar20 = pZip->m_pAlloc_opaque;
    }
    (*pZip->m_pFree)(pvVar20,__src);
    local_4c8 = (mz_zip_array)ZEXT1632(ZEXT816(0));
  }
  if ((uVar21 <= (pArray->m_central_dir).m_capacity) ||
     (mVar10 = mz_zip_array_ensure_capacity(pZip,&pArray->m_central_dir,uVar21,0), mVar10 != 0)) {
    (pArray->m_central_dir).m_size = uVar21;
  }
LAB_00120363:
  pZip->m_last_error = MZ_ZIP_ALLOC_FAILED;
  return 0;
}

Assistant:

inline mz_bool mz_zip_writer_add_from_zip_reader(mz_zip_archive* pZip, mz_zip_archive* pSource_zip,
                                                 mz_uint src_file_index) {

    mz_uint n, bit_flags, num_alignment_padding_bytes, src_central_dir_following_data_size;
    mz_uint64 src_archive_bytes_remaining, local_dir_header_ofs;
    mz_uint64 cur_src_file_ofs, cur_dst_file_ofs;
    mz_uint32 local_header_u32[(MZ_ZIP_LOCAL_DIR_HEADER_SIZE + sizeof(mz_uint32) - 1) / sizeof(mz_uint32)];
    mz_uint8* pLocal_header = (mz_uint8*)local_header_u32;
    mz_uint8 new_central_header[MZ_ZIP_CENTRAL_DIR_HEADER_SIZE];
    size_t orig_central_dir_size;
    mz_zip_internal_state* pState;
    void* pBuf;
    const mz_uint8* pSrc_central_header;
    mz_zip_archive_file_stat src_file_stat;
    mz_uint32 src_filename_len, src_comment_len, src_ext_len;
    mz_uint32 local_header_filename_size, local_header_extra_len;
    mz_uint64 local_header_comp_size, local_header_uncomp_size;
    mz_bool found_zip64_ext_data_in_ldir = MZ_FALSE;

    /* Sanity checks */
    if ((!pZip) || (!pZip->m_pState) || (pZip->m_zip_mode != MZ_ZIP_MODE_WRITING) || (!pSource_zip->m_pRead))
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);

    pState = pZip->m_pState;

    /* Don't support copying files from zip64 archives to non-zip64, even though in some cases this is possible */
    if ((pSource_zip->m_pState->m_zip64) && (!pZip->m_pState->m_zip64))
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);

    /* Get pointer to the @library central dir header and crack it */
    if (NULL == (pSrc_central_header = mz_zip_get_cdh(pSource_zip, src_file_index)))
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);

    if (MZ_READ_LE32(pSrc_central_header + MZ_ZIP_CDH_SIG_OFS) != MZ_ZIP_CENTRAL_DIR_HEADER_SIG)
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

    src_filename_len = MZ_READ_LE16(pSrc_central_header + MZ_ZIP_CDH_FILENAME_LEN_OFS);
    src_comment_len = MZ_READ_LE16(pSrc_central_header + MZ_ZIP_CDH_COMMENT_LEN_OFS);
    src_ext_len = MZ_READ_LE16(pSrc_central_header + MZ_ZIP_CDH_EXTRA_LEN_OFS);
    src_central_dir_following_data_size = src_filename_len + src_ext_len + src_comment_len;

    /* TODO: We don't support central dir's >= MZ_UINT32_MAX bytes right now (+32 fudge factor in case we need to add more extra data) */
    if ((pState->m_central_dir.m_size + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + src_central_dir_following_data_size + 32)
            >= MZ_UINT32_MAX)
        return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_CDIR_SIZE);

    num_alignment_padding_bytes = mz_zip_writer_compute_padding_needed_for_file_alignment(pZip);

    if (!pState->m_zip64) {
        if (pZip->m_total_files == MZ_UINT16_MAX)
            return mz_zip_set_error(pZip, MZ_ZIP_TOO_MANY_FILES);
    }
    else {
        /* TODO: Our zip64 support still has some 32-bit limits that may not be worth fixing. */
        if (pZip->m_total_files == MZ_UINT32_MAX)
            return mz_zip_set_error(pZip, MZ_ZIP_TOO_MANY_FILES);
    }

    if (!mz_zip_file_stat_internal(pSource_zip, src_file_index, pSrc_central_header, &src_file_stat, NULL))
        return MZ_FALSE;

    cur_src_file_ofs = src_file_stat.m_local_header_ofs;
    cur_dst_file_ofs = pZip->m_archive_size;

    /* Read the @library archive's local dir header */
    if (pSource_zip->m_pRead(pSource_zip->m_pIO_opaque,
                             cur_src_file_ofs,
                             pLocal_header,
                             MZ_ZIP_LOCAL_DIR_HEADER_SIZE) != MZ_ZIP_LOCAL_DIR_HEADER_SIZE)
        return mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);

    if (MZ_READ_LE32(pLocal_header) != MZ_ZIP_LOCAL_DIR_HEADER_SIG)
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

    cur_src_file_ofs += MZ_ZIP_LOCAL_DIR_HEADER_SIZE;

    /* Compute the total size we need to copy (filename+extra data+compressed data) */
    local_header_filename_size = MZ_READ_LE16(pLocal_header + MZ_ZIP_LDH_FILENAME_LEN_OFS);
    local_header_extra_len = MZ_READ_LE16(pLocal_header + MZ_ZIP_LDH_EXTRA_LEN_OFS);
    local_header_comp_size = MZ_READ_LE32(pLocal_header + MZ_ZIP_LDH_COMPRESSED_SIZE_OFS);
    local_header_uncomp_size = MZ_READ_LE32(pLocal_header + MZ_ZIP_LDH_DECOMPRESSED_SIZE_OFS);
    src_archive_bytes_remaining = local_header_filename_size + local_header_extra_len + src_file_stat.m_comp_size;

    /* Try to find a zip64 extended information field */
    if ((local_header_extra_len)
            && ((local_header_comp_size == MZ_UINT32_MAX) || (local_header_uncomp_size == MZ_UINT32_MAX))) {
        mz_zip_array file_data_array;
        const mz_uint8* pExtra_data;
        mz_uint32 extra_size_remaining = local_header_extra_len;

        mz_zip_array_init(&file_data_array, 1);
        if (!mz_zip_array_resize(pZip, &file_data_array, local_header_extra_len, MZ_FALSE)) {
            return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
        }

        if (pSource_zip->m_pRead(pSource_zip->m_pIO_opaque,
                                 src_file_stat.m_local_header_ofs + MZ_ZIP_LOCAL_DIR_HEADER_SIZE
                                         + local_header_filename_size,
                                 file_data_array.m_p,
                                 local_header_extra_len) != local_header_extra_len) {
            mz_zip_array_clear(pZip, &file_data_array);
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);
        }

        pExtra_data = (const mz_uint8*)file_data_array.m_p;

        do {
            mz_uint32 field_id, field_data_size, field_total_size;

            if (extra_size_remaining < (sizeof(mz_uint16) * 2)) {
                mz_zip_array_clear(pZip, &file_data_array);
                return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);
            }

            field_id = MZ_READ_LE16(pExtra_data);
            field_data_size = MZ_READ_LE16(pExtra_data + sizeof(mz_uint16));
            field_total_size = field_data_size + sizeof(mz_uint16) * 2;

            if (field_total_size > extra_size_remaining) {
                mz_zip_array_clear(pZip, &file_data_array);
                return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);
            }

            if (field_id == MZ_ZIP64_EXTENDED_INFORMATION_FIELD_HEADER_ID) {
                const mz_uint8* pSrc_field_data = pExtra_data + sizeof(mz_uint32);

                if (field_data_size < sizeof(mz_uint64) * 2) {
                    mz_zip_array_clear(pZip, &file_data_array);
                    return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);
                }

                local_header_uncomp_size = MZ_READ_LE64(pSrc_field_data);
                local_header_comp_size = MZ_READ_LE64(
                        pSrc_field_data + sizeof(mz_uint64)); /* may be 0 if there's a descriptor */

                found_zip64_ext_data_in_ldir = MZ_TRUE;
                break;
            }

            pExtra_data += field_total_size;
            extra_size_remaining -= field_total_size;
        } while (extra_size_remaining);

        mz_zip_array_clear(pZip, &file_data_array);
    }

    if (!pState->m_zip64) {
        /* Try to detect if the new archive will most likely wind up too big and bail early (+(sizeof(mz_uint32) * 4) is for the optional descriptor which could be present, +64 is a fudge factor). */
        /* We also check when the archive is finalized so this doesn't need to be perfect. */
        mz_uint64 approx_new_archive_size =
                          cur_dst_file_ofs + num_alignment_padding_bytes + MZ_ZIP_LOCAL_DIR_HEADER_SIZE
                                  + src_archive_bytes_remaining + (sizeof(mz_uint32) * 4) + pState->m_central_dir.m_size
                                  + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + src_central_dir_following_data_size
                                  + MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIZE + 64;

        if (approx_new_archive_size >= MZ_UINT32_MAX)
            return mz_zip_set_error(pZip, MZ_ZIP_ARCHIVE_TOO_LARGE);
    }

    /* Write dest archive padding */
    if (!mz_zip_writer_write_zeros(pZip, cur_dst_file_ofs, num_alignment_padding_bytes))
        return MZ_FALSE;

    cur_dst_file_ofs += num_alignment_padding_bytes;

    local_dir_header_ofs = cur_dst_file_ofs;
    if (pZip->m_file_offset_alignment) {
        MZ_ASSERT((local_dir_header_ofs & (pZip->m_file_offset_alignment - 1)) == 0);
    }

    /* The original zip's local header+ext block doesn't change, even with zip64, so we can just copy it over to the dest zip */
    if (pZip->m_pWrite(pZip->m_pIO_opaque,
                       cur_dst_file_ofs,
                       pLocal_header,
                       MZ_ZIP_LOCAL_DIR_HEADER_SIZE) != MZ_ZIP_LOCAL_DIR_HEADER_SIZE)
        return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);

    cur_dst_file_ofs += MZ_ZIP_LOCAL_DIR_HEADER_SIZE;

    /* Copy over the @library archive bytes to the dest archive, also ensure we have enough buf space to handle optional data descriptor */
    if (NULL == (pBuf = pZip->m_pAlloc(pZip->m_pAlloc_opaque,
                                       1,
                                       (size_t)MZ_MAX(32U,
                                                      MZ_MIN((mz_uint64)MZ_ZIP_MAX_IO_BUF_SIZE,
                                                             src_archive_bytes_remaining)))))
        return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);

    while (src_archive_bytes_remaining) {
        n = (mz_uint)MZ_MIN((mz_uint64)MZ_ZIP_MAX_IO_BUF_SIZE, src_archive_bytes_remaining);
        if (pSource_zip->m_pRead(pSource_zip->m_pIO_opaque, cur_src_file_ofs, pBuf, n) != n) {
            pZip->m_pFree(pZip->m_pAlloc_opaque, pBuf);
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);
        }
        cur_src_file_ofs += n;

        if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_dst_file_ofs, pBuf, n) != n) {
            pZip->m_pFree(pZip->m_pAlloc_opaque, pBuf);
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);
        }
        cur_dst_file_ofs += n;

        src_archive_bytes_remaining -= n;
    }

    /* Now deal with the optional data descriptor */
    bit_flags = MZ_READ_LE16(pLocal_header + MZ_ZIP_LDH_BIT_FLAG_OFS);
    if (bit_flags & 8) {
        /* Copy data descriptor */
        if ((pSource_zip->m_pState->m_zip64) || (found_zip64_ext_data_in_ldir)) {
            /* src is zip64, dest must be zip64 */

            /* name			uint32_t's */
            /* id				1 (optional in zip64?) */
            /* crc			1 */
            /* comp_size	2 */
            /* uncomp_size 2 */
            if (pSource_zip->m_pRead(pSource_zip->m_pIO_opaque,
                                     cur_src_file_ofs,
                                     pBuf,
                                     (sizeof(mz_uint32) * 6)) != (sizeof(mz_uint32) * 6)) {
                pZip->m_pFree(pZip->m_pAlloc_opaque, pBuf);
                return mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);
            }

            n = sizeof(mz_uint32) * ((MZ_READ_LE32(pBuf) == MZ_ZIP_DATA_DESCRIPTOR_ID) ? 6 : 5);
        }
        else {
            /* src is NOT zip64 */
            mz_bool has_id;

            if (pSource_zip->m_pRead(pSource_zip->m_pIO_opaque,
                                     cur_src_file_ofs,
                                     pBuf,
                                     sizeof(mz_uint32) * 4) != sizeof(mz_uint32) * 4) {
                pZip->m_pFree(pZip->m_pAlloc_opaque, pBuf);
                return mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);
            }

            has_id = (MZ_READ_LE32(pBuf) == MZ_ZIP_DATA_DESCRIPTOR_ID);

            if (pZip->m_pState->m_zip64) {
                /* dest is zip64, so upgrade the data descriptor */
                const mz_uint32* pSrc_descriptor = (const mz_uint32*)((const mz_uint8*)pBuf
                        + (has_id ? sizeof(mz_uint32) : 0));
                const mz_uint32 src_crc32 = pSrc_descriptor[0];
                const mz_uint64 src_comp_size = pSrc_descriptor[1];
                const mz_uint64 src_uncomp_size = pSrc_descriptor[2];

                mz_write_le32((mz_uint8*)pBuf, MZ_ZIP_DATA_DESCRIPTOR_ID);
                mz_write_le32((mz_uint8*)pBuf + sizeof(mz_uint32) * 1, src_crc32);
                mz_write_le64((mz_uint8*)pBuf + sizeof(mz_uint32) * 2, src_comp_size);
                mz_write_le64((mz_uint8*)pBuf + sizeof(mz_uint32) * 4, src_uncomp_size);

                n = sizeof(mz_uint32) * 6;
            }
            else {
                /* dest is NOT zip64, just copy it as-is */
                n = sizeof(mz_uint32) * (has_id ? 4 : 3);
            }
        }

        if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_dst_file_ofs, pBuf, n) != n) {
            pZip->m_pFree(pZip->m_pAlloc_opaque, pBuf);
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);
        }

        cur_src_file_ofs += n;
        cur_dst_file_ofs += n;
    }
    pZip->m_pFree(pZip->m_pAlloc_opaque, pBuf);

    /* Finally, add the new central dir header */
    orig_central_dir_size = pState->m_central_dir.m_size;

    memcpy(new_central_header, pSrc_central_header, MZ_ZIP_CENTRAL_DIR_HEADER_SIZE);

    if (pState->m_zip64) {
        /* This is the painful part: We need to write a new central dir header + ext block with updated zip64 fields, and ensure the old fields (if any) are not included. */
        const mz_uint8* pSrc_ext = pSrc_central_header + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + src_filename_len;
        mz_zip_array new_ext_block;

        mz_zip_array_init(&new_ext_block, sizeof(mz_uint8));

        MZ_WRITE_LE32(new_central_header + MZ_ZIP_CDH_COMPRESSED_SIZE_OFS, MZ_UINT32_MAX);
        MZ_WRITE_LE32(new_central_header + MZ_ZIP_CDH_DECOMPRESSED_SIZE_OFS, MZ_UINT32_MAX);
        MZ_WRITE_LE32(new_central_header + MZ_ZIP_CDH_LOCAL_HEADER_OFS, MZ_UINT32_MAX);

        if (!mz_zip_writer_update_zip64_extension_block(&new_ext_block,
                                                        pZip,
                                                        pSrc_ext,
                                                        src_ext_len,
                                                        &src_file_stat.m_comp_size,
                                                        &src_file_stat.m_uncomp_size,
                                                        &local_dir_header_ofs,
                                                        NULL)) {
            mz_zip_array_clear(pZip, &new_ext_block);
            return MZ_FALSE;
        }

        MZ_WRITE_LE16(new_central_header + MZ_ZIP_CDH_EXTRA_LEN_OFS, new_ext_block.m_size);

        if (!mz_zip_array_push_back(pZip, &pState->m_central_dir, new_central_header, MZ_ZIP_CENTRAL_DIR_HEADER_SIZE)) {
            mz_zip_array_clear(pZip, &new_ext_block);
            return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
        }

        if (!mz_zip_array_push_back(pZip,
                                    &pState->m_central_dir,
                                    pSrc_central_header + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE,
                                    src_filename_len)) {
            mz_zip_array_clear(pZip, &new_ext_block);
            mz_zip_array_resize(pZip, &pState->m_central_dir, orig_central_dir_size, MZ_FALSE);
            return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
        }

        if (!mz_zip_array_push_back(pZip, &pState->m_central_dir, new_ext_block.m_p, new_ext_block.m_size)) {
            mz_zip_array_clear(pZip, &new_ext_block);
            mz_zip_array_resize(pZip, &pState->m_central_dir, orig_central_dir_size, MZ_FALSE);
            return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
        }

        if (!mz_zip_array_push_back(pZip,
                                    &pState->m_central_dir,
                                    pSrc_central_header + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + src_filename_len
                                            + src_ext_len,
                                    src_comment_len)) {
            mz_zip_array_clear(pZip, &new_ext_block);
            mz_zip_array_resize(pZip, &pState->m_central_dir, orig_central_dir_size, MZ_FALSE);
            return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
        }

        mz_zip_array_clear(pZip, &new_ext_block);
    }
    else {
        /* sanity checks */
        if (cur_dst_file_ofs > MZ_UINT32_MAX)
            return mz_zip_set_error(pZip, MZ_ZIP_ARCHIVE_TOO_LARGE);

        if (local_dir_header_ofs >= MZ_UINT32_MAX)
            return mz_zip_set_error(pZip, MZ_ZIP_ARCHIVE_TOO_LARGE);

        MZ_WRITE_LE32(new_central_header + MZ_ZIP_CDH_LOCAL_HEADER_OFS, local_dir_header_ofs);

        if (!mz_zip_array_push_back(pZip, &pState->m_central_dir, new_central_header, MZ_ZIP_CENTRAL_DIR_HEADER_SIZE))
            return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);

        if (!mz_zip_array_push_back(pZip,
                                    &pState->m_central_dir,
                                    pSrc_central_header + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE,
                                    src_central_dir_following_data_size)) {
            mz_zip_array_resize(pZip, &pState->m_central_dir, orig_central_dir_size, MZ_FALSE);
            return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
        }
    }

    /* This shouldn't trigger unless we screwed up during the initial sanity checks */
    if (pState->m_central_dir.m_size >= MZ_UINT32_MAX) {
        /* TODO: Support central dirs >= 32-bits in size */
        mz_zip_array_resize(pZip, &pState->m_central_dir, orig_central_dir_size, MZ_FALSE);
        return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_CDIR_SIZE);
    }

    n = (mz_uint32)orig_central_dir_size;
    if (!mz_zip_array_push_back(pZip, &pState->m_central_dir_offsets, &n, 1)) {
        mz_zip_array_resize(pZip, &pState->m_central_dir, orig_central_dir_size, MZ_FALSE);
        return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
    }

    pZip->m_total_files++;
    pZip->m_archive_size = cur_dst_file_ofs;

    return MZ_TRUE;
}